

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * __thiscall
CTape::produce_letter_abi_cxx11_(string *__return_storage_ptr__,CTape *this,char letter)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  mapped_type *pmVar4;
  int iVar5;
  double __x;
  double __x_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  CNumber<30> local_d0;
  CNumber<27> local_cc;
  string local_c8;
  int local_a4;
  CNumber<27> local_a0;
  int dist_res;
  CNumber<30> local_98;
  int dist_change;
  int iStack_90;
  int dist_move;
  size_type i;
  int min_change;
  int min_move;
  int min_dist;
  int min_pos;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  char local_19;
  CTape *pCStack_18;
  char letter_local;
  CTape *this_local;
  string *result;
  
  local_19 = letter;
  pCStack_18 = this;
  this_local = (CTape *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"producing letter ",&local_61);
  std::operator+(&local_40,&local_60,local_19);
  debug::log(__x);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  min_dist._3_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  min_move = -1;
  min_change = 0x39;
  for (_iStack_90 = 0; uVar1 = _iStack_90,
      sVar2 = std::vector<CNumber<27>,_std::allocator<CNumber<27>_>_>::size(&this->m_tape),
      uVar1 < sVar2; _iStack_90 = _iStack_90 + 1) {
    CNumber<30>::CNumber(&local_98,iStack_90);
    dist_change = CNumber<30>::shortest(&this->m_pos,&local_98);
    pvVar3 = std::vector<CNumber<27>,_std::allocator<CNumber<27>_>_>::operator[]
                       (&this->m_tape,_iStack_90);
    pmVar4 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](&this->m_l2t,&local_19);
    CNumber<27>::CNumber(&local_a0,*pmVar4);
    dist_res = CNumber<27>::shortest(pvVar3,&local_a0);
    local_a4 = dist_change;
    if (dist_change < 1) {
      local_a4 = -dist_change;
    }
    iVar5 = dist_res;
    if (dist_res < 1) {
      iVar5 = -dist_res;
    }
    local_a4 = local_a4 + iVar5;
    if (local_a4 < min_change) {
      i._4_4_ = dist_change;
      min_move = (int)_iStack_90;
      i._0_4_ = dist_res;
      min_change = local_a4;
    }
  }
  get_algorithm_abi_cxx11_(&local_c8,(CTape *)(ulong)i._4_4_,(int)i,(int)sVar2);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  pmVar4 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
           operator[](&this->m_l2t,&local_19);
  CNumber<27>::CNumber(&local_cc,*pmVar4);
  pvVar3 = std::vector<CNumber<27>,_std::allocator<CNumber<27>_>_>::operator[]
                     (&this->m_tape,(long)min_move);
  pvVar3->m_number = local_cc.m_number;
  CNumber<30>::CNumber(&local_d0,min_move);
  (this->m_pos).m_number = local_d0.m_number;
  std::operator+(&local_f0,"produced result: ",__return_storage_ptr__);
  debug::log(__x_00);
  std::__cxx11::string::~string((string *)&local_f0);
  return __return_storage_ptr__;
}

Assistant:

std::string produce_letter(const char letter)
        {
            debug::log(std::string("producing letter ") + letter);
            std::string result;
            int min_pos = -1;
            int min_dist = TAPE_LENGTH + LETTERS_COUNT;  // Above in any way
            int min_move, min_change;
            for (tape_t::size_type i = 0; i < m_tape.size(); ++i)
            {
                int dist_move = m_pos.shortest(i);
                int dist_change = m_tape[i].shortest(m_l2t[letter]);
                int dist_res = std::abs(dist_move) + std::abs(dist_change);
                if (min_dist > dist_res)
                {
                    min_dist = dist_res;
                    min_move = dist_move;
                    min_change = dist_change;
                    min_pos = i;
                }
            }

            if (-1 == min_pos)
            {
                assert("broken logic");
            }

            result = get_algorithm(min_move, min_change);
            m_tape[min_pos] = m_l2t[letter];    // change tape
            m_pos = min_pos;                    // move pointer
            debug::log("produced result: " + result);
            return result;
        }